

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O1

rfc5444_result cb_end_addr(rfc5444_reader_tlvblock_context *ctx,_Bool dropped)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  
  uVar1 = ctx->consumer->order;
  bVar3 = (ctx->addr)._addr[3] - 1;
  printf("%s: address %d end (order %d): %d\n","cb_end_addr",(ulong)(bVar3 + 1),(ulong)uVar1,
         (ulong)(uint)callback_index);
  lVar4 = (ulong)bVar3 * 4;
  iVar2 = callback_index + 1;
  *(int *)(lVar4 + (long)(int)uVar1 * 8 + 0x114608) = callback_index;
  callback_index = iVar2;
  return *(rfc5444_result *)(lVar4 + (long)(int)uVar1 * 8 + 0x114618);
}

Assistant:

static enum rfc5444_result
cb_end_addr(struct rfc5444_reader_tlvblock_context *ctx,
    bool dropped __attribute__ ((unused))) {
  int oi = ctx->consumer->order - 1;
  const uint8_t *addr = netaddr_get_binptr(&ctx->addr);
  const uint8_t ai = addr[3] - 1;

#ifdef PRINT_CB
  printf("%s: address %d end (order %d): %d\n", __func__, ai+1, ctx->consumer->order, callback_index);
#endif
  idxcb_end_address[oi][ai] = callback_index++;
  return result_end_address[oi][ai];
}